

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void * duckdb_je_malloc_default(size_t size)

{
  cache_bin_stats_t *pcVar1;
  tcache_t *ptVar2;
  uint16_t uVar3;
  void **ppvVar4;
  uint64_t uVar5;
  void **ppvVar6;
  long lVar7;
  _Bool _Var8;
  szind_t sVar9;
  tsd_t *tsd;
  arena_t *paVar10;
  void *pvVar11;
  int *piVar12;
  atomic_p_t arena;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  uint ind;
  cache_bin_t *pcVar16;
  long *in_FS_OFFSET;
  _Bool slab;
  uintptr_t args [3];
  te_ctx_t local_68;
  arena_t *local_38;
  
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if ((*(char *)(*in_FS_OFFSET + -0x2758) == '\0') ||
     (tsd = duckdb_je_tsd_fetch_slow(tsd,false), (tsd->state).repr == '\0')) {
    if (size < 0x1001) {
      sVar9 = (szind_t)duckdb_je_sz_size2index_tab[size + 7 >> 3];
    }
    else {
      sVar9 = sz_size2index_compute(size);
    }
    if (0xe7 < sVar9) goto LAB_01150b36;
    uVar14 = duckdb_je_sz_index2size_tab[sVar9];
    ptVar2 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    if (uVar14 < 0x3801) {
      pcVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + sVar9;
      ppvVar4 = pcVar16->stack_head;
      pvVar11 = *ppvVar4;
      ppvVar6 = ppvVar4 + 1;
      uVar3 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
              low_bits_low_water;
      if (uVar3 == (uint16_t)ppvVar4) {
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
            low_bits_empty == uVar3) {
          pvVar11 = (void *)0x0;
          paVar10 = arena_choose(tsd,(arena_t *)0x0);
          if (paVar10 == (arena_t *)0x0) goto LAB_01150647;
          if (pcVar16->stack_head == (void **)&duckdb_je_disabled_bin) {
            _Var8 = true;
            goto LAB_0115081d;
          }
          duckdb_je_tcache_bin_flush_stashed(tsd,ptVar2,pcVar16,sVar9,true);
          pvVar11 = duckdb_je_tcache_alloc_small_hard
                              ((tsdn_t *)tsd,paVar10,ptVar2,pcVar16,sVar9,&local_68.is_alloc);
          if (local_68.is_alloc == false) goto LAB_01150b36;
        }
        else {
          pcVar16->stack_head = ppvVar6;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
          low_bits_low_water = (uint16_t)ppvVar6;
        }
      }
      else {
        pcVar16->stack_head = ppvVar6;
      }
      pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
                tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
    }
    else if ((sVar9 < ptVar2->tcache_slow->tcache_nbins) &&
            (ppvVar6 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                       [sVar9].stack_head, ppvVar6 != (void **)&duckdb_je_disabled_bin)) {
      pcVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + sVar9;
      pvVar11 = *ppvVar6;
      ppvVar4 = ppvVar6 + 1;
      uVar3 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
              low_bits_low_water;
      if (uVar3 == (uint16_t)ppvVar6) {
        if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
            low_bits_empty == uVar3) {
          paVar10 = arena_choose(tsd,(arena_t *)0x0);
          if (paVar10 == (arena_t *)0x0) goto LAB_01150b36;
          duckdb_je_tcache_bin_flush_stashed(tsd,ptVar2,pcVar16,sVar9,false);
          if (size < 0x1001) {
            sVar15 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
          }
          else if (size < 0x7000000000000001) {
            uVar13 = size * 2 - 1;
            lVar7 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
              }
            }
            uVar13 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
            sVar15 = ~uVar13 + size & uVar13;
          }
          else {
            sVar15 = 0;
          }
          pvVar11 = duckdb_je_large_malloc((tsdn_t *)tsd,paVar10,sVar15,false);
          goto LAB_01150647;
        }
        pcVar16->stack_head = ppvVar4;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
        low_bits_low_water = (uint16_t)ppvVar4;
      }
      else {
        pcVar16->stack_head = ppvVar4;
      }
      pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[sVar9].
                tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
    }
    else {
      paVar10 = (arena_t *)0x0;
      _Var8 = false;
LAB_0115081d:
      pvVar11 = duckdb_je_arena_malloc_hard((tsdn_t *)tsd,paVar10,size,sVar9,false,_Var8);
    }
LAB_01150647:
    if (pvVar11 != (void *)0x0) {
      local_68.is_alloc = true;
      local_68.current =
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      local_68.last_event =
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
      local_68.next_event =
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
      local_68.next_event_fast =
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
      uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar5 + uVar14;
      if (uVar14 < tsd->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event
                   - uVar5) {
        return pvVar11;
      }
      duckdb_je_te_event_trigger(tsd,&local_68);
      return pvVar11;
    }
LAB_01150b36:
    piVar12 = __errno_location();
    *piVar12 = 0xc;
    return (void *)0x0;
  }
  if ((duckdb_je_malloc_init_state != malloc_init_initialized) &&
     (_Var8 = malloc_init_hard(), _Var8)) goto LAB_01150b36;
  _Var8 = duckdb_je_opt_zero;
  if (size < 0x1001) {
    uVar14 = (ulong)duckdb_je_sz_size2index_tab[size + 7 >> 3];
  }
  else {
    sVar9 = sz_size2index_compute(size);
    uVar14 = (ulong)sVar9;
  }
  ind = (uint)uVar14;
  if (ind < 0xe8) {
    uVar13 = duckdb_je_sz_index2size_tab[uVar14];
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == false) {
LAB_01150912:
        arena.repr = (arena_t *)0x0;
LAB_01150914:
        slab = uVar13 < 0x3801;
LAB_01150923:
        pvVar11 = duckdb_je_arena_malloc_hard((tsdn_t *)tsd,arena.repr,size,ind,_Var8,slab);
      }
      else {
        ptVar2 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        if (0x3800 < uVar13) {
          if ((ind < ptVar2->tcache_slow->tcache_nbins) &&
             (ppvVar6 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                        [uVar14].stack_head, ppvVar6 != (void **)&duckdb_je_disabled_bin)) {
            pcVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins +
                      uVar14;
            pvVar11 = *ppvVar6;
            ppvVar4 = ppvVar6 + 1;
            uVar3 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14]
                    .low_bits_low_water;
            if (uVar3 == (uint16_t)ppvVar6) {
              if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14].
                  low_bits_empty == uVar3) {
                paVar10 = arena_choose(tsd,(arena_t *)0x0);
                if (paVar10 != (arena_t *)0x0) {
                  duckdb_je_tcache_bin_flush_stashed(tsd,ptVar2,pcVar16,ind,false);
                  if (size < 0x1001) {
                    sVar15 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]]
                    ;
                  }
                  else if (size < 0x7000000000000001) {
                    uVar14 = size * 2 - 1;
                    lVar7 = 0x3f;
                    if (uVar14 != 0) {
                      for (; uVar14 >> lVar7 == 0; lVar7 = lVar7 + -1) {
                      }
                    }
                    uVar14 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
                    sVar15 = ~uVar14 + size & uVar14;
                  }
                  else {
                    sVar15 = 0;
                  }
                  pvVar11 = duckdb_je_large_malloc((tsdn_t *)tsd,paVar10,sVar15,_Var8);
                  goto LAB_0115093e;
                }
                goto LAB_01150cf4;
              }
              pcVar16->stack_head = ppvVar4;
              (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14].
              low_bits_low_water = (uint16_t)ppvVar4;
            }
            else {
              pcVar16->stack_head = ppvVar4;
            }
            if (_Var8 != false) {
              switchD_005681f0::default(pvVar11,0,duckdb_je_sz_index2size_tab[uVar14]);
            }
            pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                      [uVar14].tstats;
            pcVar1->nrequests = pcVar1->nrequests + 1;
            goto LAB_0115093e;
          }
          slab = false;
          arena.repr = (arena_t *)0x0;
          goto LAB_01150923;
        }
        pcVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar14;
        ppvVar4 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14].
                  stack_head;
        pvVar11 = *ppvVar4;
        ppvVar6 = ppvVar4 + 1;
        uVar3 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14].
                low_bits_low_water;
        if (uVar3 == (uint16_t)ppvVar4) {
          if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14].
              low_bits_empty != uVar3) {
            pcVar16->stack_head = ppvVar6;
            (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14].
            low_bits_low_water = (uint16_t)ppvVar6;
            goto LAB_0115077b;
          }
          pvVar11 = (void *)0x0;
          local_38 = arena_choose(tsd,(arena_t *)0x0);
          if (local_38 != (arena_t *)0x0) {
            if (pcVar16->stack_head != (void **)&duckdb_je_disabled_bin) {
              duckdb_je_tcache_bin_flush_stashed(tsd,ptVar2,pcVar16,ind,true);
              pvVar11 = duckdb_je_tcache_alloc_small_hard
                                  ((tsdn_t *)tsd,local_38,ptVar2,pcVar16,ind,&local_68.is_alloc);
              if (local_68.is_alloc == false) goto LAB_01150cf4;
              goto LAB_0115077b;
            }
            pvVar11 = duckdb_je_arena_malloc_hard((tsdn_t *)tsd,local_38,size,ind,_Var8,true);
          }
        }
        else {
          pcVar16->stack_head = ppvVar6;
LAB_0115077b:
          if (_Var8 != false) {
            switchD_005681f0::default(pvVar11,0,duckdb_je_sz_index2size_tab[uVar14]);
          }
          pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar14]
                    .tstats;
          pcVar1->nrequests = pcVar1->nrequests + 1;
        }
      }
LAB_0115093e:
      if (pvVar11 != (void *)0x0) {
        local_68.is_alloc = true;
        local_68.current =
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
        local_68.last_event =
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event
        ;
        local_68.next_event =
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event
        ;
        local_68.next_event_fast =
             &tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast
        ;
        uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
        tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar5 + uVar13
        ;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
            uVar5 <= uVar13) {
          duckdb_je_te_event_trigger(tsd,&local_68);
        }
        if ((_Var8 == false) && (duckdb_je_opt_junk_alloc == true)) {
          switchD_005681f0::default(pvVar11,0xa5,uVar13);
        }
        goto LAB_011509ac;
      }
    }
    else {
      arena.repr = duckdb_je_arenas[0].repr;
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
      }
      if ((arena_t *)arena.repr != (arena_t *)0x0) goto LAB_01150914;
      if (duckdb_je_narenas_auto != 0) goto LAB_01150912;
    }
  }
LAB_01150cf4:
  piVar12 = __errno_location();
  *piVar12 = 0xc;
  pvVar11 = (void *)0x0;
LAB_011509ac:
  local_68.current = (uint64_t *)0x0;
  local_68.last_event = (uint64_t *)0x0;
  local_68._0_8_ = size;
  duckdb_je_hook_invoke_alloc(hook_alloc_malloc,pvVar11,(uintptr_t)pvVar11,(uintptr_t *)&local_68);
  return pvVar11;
}

Assistant:

JEMALLOC_NOINLINE
void *
malloc_default(size_t size) {
	void *ret;
	static_opts_t sopts;
	dynamic_opts_t dopts;

	/*
	 * This variant has logging hook on exit but not on entry.  It's callled
	 * only by je_malloc, below, which emits the entry one for us (and, if
	 * it calls us, does so only via tail call).
	 */

	static_opts_init(&sopts);
	dynamic_opts_init(&dopts);

	sopts.null_out_result_on_error = true;
	sopts.set_errno_on_error = true;
	sopts.oom_string = "<jemalloc>: Error in malloc(): out of memory\n";

	dopts.result = &ret;
	dopts.num_items = 1;
	dopts.item_size = size;

	imalloc(&sopts, &dopts);
	/*
	 * Note that this branch gets optimized away -- it immediately follows
	 * the check on tsd_fast that sets sopts.slow.
	 */
	if (sopts.slow) {
		uintptr_t args[3] = {size};
		hook_invoke_alloc(hook_alloc_malloc, ret, (uintptr_t)ret, args);
	}

	return ret;
}